

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int xmlLookupCharEncodingHandler(xmlCharEncoding enc,xmlCharEncodingHandler **out)

{
  xmlCharEncodingHandler *pxVar1;
  xmlCharEncodingHandler *handler;
  xmlCharEncodingHandler **out_local;
  xmlCharEncoding enc_local;
  
  if (out == (xmlCharEncodingHandler **)0x0) {
    out_local._4_4_ = 0x73;
  }
  else {
    *out = (xmlCharEncodingHandler *)0x0;
    if ((enc < XML_CHAR_ENCODING_UTF8) || (0x1e < (uint)enc)) {
      out_local._4_4_ = 0x20;
    }
    else if ((enc == XML_CHAR_ENCODING_UTF8) || (enc == XML_CHAR_ENCODING_NONE)) {
      out_local._4_4_ = 0;
    }
    else {
      pxVar1 = defaultHandlers + enc;
      if ((defaultHandlers[enc].input == (xmlCharEncodingInputFunc)0x0) &&
         (defaultHandlers[enc].output == (xmlCharEncodingOutputFunc)0x0)) {
        if (pxVar1->name == (char *)0x0) {
          out_local._4_4_ = 0x20;
        }
        else {
          out_local._4_4_ =
               xmlFindExtraHandler(pxVar1->name,pxVar1->name,0,(xmlCharEncConvImpl)0x0,(void *)0x0,
                                   out);
        }
      }
      else {
        *out = pxVar1;
        out_local._4_4_ = 0;
      }
    }
  }
  return out_local._4_4_;
}

Assistant:

int
xmlLookupCharEncodingHandler(xmlCharEncoding enc,
                             xmlCharEncodingHandler **out) {
    const xmlCharEncodingHandler *handler;

    if (out == NULL)
        return(XML_ERR_ARGUMENT);
    *out = NULL;

    if ((enc <= 0) || ((size_t) enc >= NUM_DEFAULT_HANDLERS))
        return(XML_ERR_UNSUPPORTED_ENCODING);

    /* Return NULL handler for UTF-8 */
    if ((enc == XML_CHAR_ENCODING_UTF8) ||
        (enc == XML_CHAR_ENCODING_NONE))
        return(XML_ERR_OK);

    handler = &defaultHandlers[enc];
    if ((handler->input != NULL) || (handler->output != NULL)) {
        *out = (xmlCharEncodingHandler *) handler;
        return(XML_ERR_OK);
    }

    if (handler->name != NULL)
        return(xmlFindExtraHandler(handler->name, handler->name, 0,
                                   NULL, NULL, out));

    return(XML_ERR_UNSUPPORTED_ENCODING);
}